

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void ui_begin(float dt,float row,float sec)

{
  ImFontAtlas *pIVar1;
  ImGuiIO *pIVar2;
  float fVar3;
  float fVar4;
  bool show_demo_window;
  bool local_21;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  local_1c = dt * 1000.0;
  g.frame_times[g.frame_times_cursor] = local_1c;
  g.frame_times_cursor = g.frame_times_cursor + 1 & 0x1ff;
  local_20 = dt;
  local_18 = row;
  local_14 = sec;
  ImGui_ImplOpenGL2_NewFrame();
  pIVar2 = ImGui::GetIO();
  pIVar2->DeltaTime = local_20;
  pIVar1 = pIVar2->Fonts;
  if ((0 < (pIVar1->Fonts).Size) &&
     ((pIVar1->TexPixelsAlpha8 != (uchar *)0x0 || (pIVar1->TexPixelsRGBA32 != (uint *)0x0)))) {
    ImGui::NewFrame();
    local_21 = true;
    ImGui::ShowDemoWindow(&local_21);
    ImGui::PlotLines("frame time",g.frame_times,0x200,g.frame_times_cursor,(char *)0x0,0.0,
                     3.4028235e+38,(ImVec2)0x42c8000000000000,4);
    ImGui::LabelText("","dt: %.3fms",(double)local_1c);
    ImGui::LabelText("","fps: %.3f",(double)(1.0 / local_20));
    ImGui::LabelText("","row: %d",(ulong)(uint)(int)local_18);
    fVar4 = local_14 / 60.0;
    fVar3 = fmodf(local_14,60.0);
    ImGui::LabelText("","t: %02d:%06.3f",(double)fVar3,(ulong)(uint)(int)fVar4);
    return;
  }
  __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/ui.cpp"
                ,0x5b,"void ui_begin(float, float, float)");
}

Assistant:

void ui_begin(float dt, float row, float sec) {
	g.frame_times[g.frame_times_cursor] = dt * 1000.f;
	g.frame_times_cursor = (g.frame_times_cursor + 1) % COUNTOF(g.frame_times);
	// if (ImGui::Button("Save"))
	// 			MySaveFunction();
	// ImGui::InputText("string", buf, IM_ARRAYSIZE(buf));
	// ImGui::SliderFloat("float", &f, 0.0f, 1.0f);

	{
		ImGui_ImplOpenGL2_NewFrame();
		ImGuiIO& io = ImGui::GetIO();
		io.DeltaTime = dt;
		IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

		ImGui::NewFrame();
	}

	//ImGui::Text("Hello, world %d", 123);
	bool show_demo_window = true;
	ImGui::ShowDemoWindow(&show_demo_window);

	ImGui::PlotLines("frame time", g.frame_times, COUNTOF(g.frame_times), g.frame_times_cursor, NULL, 0, FLT_MAX, ImVec2(0, 100));
	ImGui::LabelText("", "dt: %.3fms", 1000.f * dt);
	ImGui::LabelText("", "fps: %.3f", 1.f / dt);
	ImGui::LabelText("", "row: %d", (int)row);
	ImGui::LabelText("", "t: %02d:%06.3f", (int)(sec/60), fmodf(sec,60.f));
}